

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O2

int AF_A_SetRipMax(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  bool bVar1;
  char *pcVar2;
  DObject *this;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_005cb4a9;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (DObject *)0x0) {
        bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005cb4a9;
        }
        goto LAB_005cb47d;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_005cb499;
    this = (DObject *)0x0;
LAB_005cb47d:
    if (numparam == 1) {
      pcVar2 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        *(int *)&this[0x19].GCNext = param[1].field_0.i;
        return 0;
      }
      pcVar2 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1b2f,"int AF_A_SetRipMax(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
LAB_005cb499:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005cb4a9:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x1b2e,"int AF_A_SetRipMax(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_SetRipMax)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(max);
	self->RipLevelMax = max;
	return 0;
}